

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

bool __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkLinearFilteredResult
          (BlittingImages *this,ConstPixelBufferAccess *result,
          ConstPixelBufferAccess *clampedExpected,ConstPixelBufferAccess *unclampedExpected,
          TextureFormat *srcFormat)

{
  ConstPixelBufferAccess *pCVar1;
  bool bVar2;
  TextureChannelClass TVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  TextureFormat dstFormat;
  Vec4 threshold;
  Vec4 dstMaxDiff;
  string local_100;
  string local_e0;
  TextureFormat local_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  ConstPixelBufferAccess *local_70;
  Vec4 local_68;
  UVec4 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_c0 = result->m_format;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ClampedSourceImage","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"Region with clamped edges on source image.","");
  tcu::LogSection::LogSection((LogSection *)local_b8,&local_e0,&local_100);
  local_70 = unclampedExpected;
  tcu::TestLog::startSection
            ((TestLog *)this,(char *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_98._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  TVar3 = tcu::getTextureChannelClass(local_c0.type);
  if (TVar3 == TEXTURECHANNELCLASS_FLOATING_POINT) {
    bVar2 = tcu::isSRGB(*srcFormat);
    getFormatThreshold((anon_unknown_0 *)local_b8,srcFormat);
    if (bVar2) {
      fStack_3c = 2.0;
    }
    else {
      fStack_3c = 1.0;
    }
    local_48 = fStack_3c * (float)local_b8._0_4_;
    fStack_44 = fStack_3c * (float)local_b8._4_4_;
    fStack_40 = fStack_3c * fStack_b0;
    fStack_3c = fStack_3c * fStack_ac;
    getFormatThreshold((anon_unknown_0 *)&local_58,&local_c0);
    local_68.m_data[0] =
         (float)(~-(uint)((float)local_58.m_data[0] <= local_48) & local_58.m_data[0] |
                (uint)local_48 & -(uint)((float)local_58.m_data[0] <= local_48));
    local_68.m_data[1] =
         (float)(~-(uint)((float)local_58.m_data[1] <= fStack_44) & local_58.m_data[1] |
                (uint)fStack_44 & -(uint)((float)local_58.m_data[1] <= fStack_44));
    local_68.m_data[2] =
         (float)(~-(uint)((float)local_58.m_data[2] <= fStack_40) & local_58.m_data[2] |
                (uint)fStack_40 & -(uint)((float)local_58.m_data[2] <= fStack_40));
    local_68.m_data[3] =
         (float)(~-(uint)((float)local_58.m_data[3] <= fStack_3c) & local_58.m_data[3] |
                (uint)fStack_3c & -(uint)((float)local_58.m_data[3] <= fStack_3c));
    bVar2 = tcu::floatThresholdCompare
                      ((TestLog *)this,"Compare","Result comparsion",clampedExpected,result,
                       &local_68,COMPARE_LOG_RESULT);
    tcu::TestLog::endSection((TestLog *)this);
    if (bVar2) {
      return true;
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"NonClampedSourceImage","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Region with non-clamped edges on source image.","");
    tcu::LogSection::LogSection((LogSection *)local_b8,&local_e0,&local_100);
    tcu::TestLog::startSection
              ((TestLog *)this,(char *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_98._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    pCVar1 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_a8._M_allocated_capacity + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar2 = tcu::floatThresholdCompare
                      ((TestLog *)this,"Compare","Result comparsion",pCVar1,result,&local_68,
                       COMPARE_LOG_RESULT);
  }
  else {
    local_58.m_data[0] = 0;
    local_58.m_data[1] = 0;
    local_58.m_data[2] = 0;
    local_58.m_data[3] = 0;
    tcu::getTextureFormatBitDepth((tcu *)&local_68,&local_c0);
    iVar4 = (int)(float)((int)local_68.m_data[0] * 0x800000 + 0x3f800000);
    iVar6 = (int)(float)((int)local_68.m_data[1] * 0x800000 + 0x3f800000);
    iVar8 = (int)(float)((int)local_68.m_data[2] * 0x800000 + 0x3f800000);
    iVar10 = (int)(float)((int)local_68.m_data[3] * 0x800000 + 0x3f800000);
    uVar12 = (int)(((uint)(iVar4 >> 0x1f) >> 0x18) + iVar4) >> 8;
    uVar13 = (int)(((uint)(iVar6 >> 0x1f) >> 0x18) + iVar6) >> 8;
    uVar14 = (int)(((uint)(iVar8 >> 0x1f) >> 0x18) + iVar8) >> 8;
    uVar15 = (int)(((uint)(iVar10 >> 0x1f) >> 0x18) + iVar10) >> 8;
    uVar5 = -(uint)(1 < (int)uVar12);
    uVar7 = -(uint)(1 < (int)uVar13);
    uVar9 = -(uint)(1 < (int)uVar14);
    uVar11 = -(uint)(1 < (int)uVar15);
    local_58.m_data[1] = (uVar13 & uVar7) + uVar7 + 1;
    local_58.m_data[0] = (uVar12 & uVar5) + uVar5 + 1;
    local_58.m_data[3] = (uVar15 & uVar11) + uVar11 + 1;
    local_58.m_data[2] = (uVar14 & uVar9) + uVar9 + 1;
    bVar2 = tcu::intThresholdCompare
                      ((TestLog *)this,"Compare","Result comparsion",clampedExpected,result,
                       &local_58,COMPARE_LOG_RESULT);
    tcu::TestLog::endSection((TestLog *)this);
    if (bVar2) {
      return true;
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"NonClampedSourceImage","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Region with non-clamped edges on source image.","");
    tcu::LogSection::LogSection((LogSection *)local_b8,&local_e0,&local_100);
    tcu::TestLog::startSection
              ((TestLog *)this,(char *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_98._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    pCVar1 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_b8._4_4_,local_b8._0_4_),local_a8._M_allocated_capacity + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar2 = tcu::intThresholdCompare
                      ((TestLog *)this,"Compare","Result comparsion",pCVar1,result,&local_58,
                       COMPARE_LOG_RESULT);
  }
  tcu::TestLog::endSection((TestLog *)this);
  return bVar2;
}

Assistant:

bool BlittingImages::checkLinearFilteredResult (const tcu::ConstPixelBufferAccess&	result,
												const tcu::ConstPixelBufferAccess&	clampedExpected,
												const tcu::ConstPixelBufferAccess&	unclampedExpected,
												const tcu::TextureFormat&			srcFormat)
{
	tcu::TestLog&				log			(m_context.getTestContext().getLog());
	const tcu::TextureFormat	dstFormat	= result.getFormat();
	bool						isOk		= false;

	log << tcu::TestLog::Section("ClampedSourceImage", "Region with clamped edges on source image.");

	if (isFloatFormat(dstFormat))
	{
		const bool		srcIsSRGB	= tcu::isSRGB(srcFormat);
		const tcu::Vec4	srcMaxDiff	= getFormatThreshold(srcFormat) * tcu::Vec4(srcIsSRGB ? 2.0f : 1.0f);
		const tcu::Vec4	dstMaxDiff	= getFormatThreshold(dstFormat);
		const tcu::Vec4	threshold	= tcu::max(srcMaxDiff, dstMaxDiff);

		isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}
	else
	{
		tcu::UVec4	threshold;
		// Calculate threshold depending on channel width of destination format.
		const tcu::IVec4	bitDepth	= tcu::getTextureFormatBitDepth(dstFormat);
		for (deUint32 i = 0; i < 4; ++i)
			threshold[i] = de::max( (0x1 << bitDepth[i]) / 256, 1);

		isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}

	return isOk;
}